

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t icu_63::MessagePattern::validateArgumentName(UnicodeString *name)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *s;
  UnicodeString *name_local;
  
  s = UnicodeString::getBuffer(name);
  iVar2 = UnicodeString::length(name);
  UVar1 = PatternProps::isIdentifier(s,iVar2);
  if (UVar1 == '\0') {
    name_local._4_4_ = -2;
  }
  else {
    iVar2 = UnicodeString::length(name);
    name_local._4_4_ = parseArgNumber(name,0,iVar2);
  }
  return name_local._4_4_;
}

Assistant:

int32_t
MessagePattern::validateArgumentName(const UnicodeString &name) {
    if(!PatternProps::isIdentifier(name.getBuffer(), name.length())) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    }
    return parseArgNumber(name, 0, name.length());
}